

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int notation1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  
  if (tok == 0xf) {
    return 0x11;
  }
  if (tok == 0x12) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"SYSTEM");
    iVar3 = 0x11;
    if (iVar1 != 0) {
      pcVar2 = notation3;
      goto LAB_005eeb5f;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"PUBLIC");
    if (iVar1 != 0) {
      pcVar2 = notation2;
      goto LAB_005eeb5f;
    }
  }
  iVar3 = -1;
  pcVar2 = error;
LAB_005eeb5f:
  state->handler = pcVar2;
  return iVar3;
}

Assistant:

static int PTRCALL
notation1(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
          const ENCODING *enc) {
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NOTATION_NONE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_SYSTEM)) {
      state->handler = notation3;
      return XML_ROLE_NOTATION_NONE;
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_PUBLIC)) {
      state->handler = notation2;
      return XML_ROLE_NOTATION_NONE;
    }
    break;
  }
  return common(state, tok);
}